

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

Scene * red_blue(void)

{
  Point3 look_from;
  Point3 look_at;
  Scene *in_RDI;
  double r;
  ObjectList objects;
  Camera camera;
  undefined1 local_1d0 [24];
  undefined1 local_1b8 [24];
  vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_> local_1a0;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  value_type local_128;
  value_type local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  Camera local_e8;
  
  local_1b8._16_8_ = &PTR_hit_00112b20;
  local_1a0.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d0._16_8_ = 0.7071067811865476;
  local_e8.origin_.e[0] = -0.7071067811865476;
  local_e8.origin_.e[1] = 0.0;
  local_e8.origin_.e[2] = -1.0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0x3ff0000000000000;
  std::make_shared<Lambertian,Vec3>((Vec3 *)local_1d0);
  std::make_shared<Sphere,Vec3,double&,std::shared_ptr<Lambertian>>
            ((Vec3 *)local_1b8,(double *)&local_e8,(shared_ptr<Lambertian> *)(local_1d0 + 0x10));
  local_118.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1b8._0_8_;
  local_118.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
  local_1b8._0_8_ = (element_type *)0x0;
  local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
            (&local_1a0,&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
  local_e8.origin_.e[0] = (double)local_1d0._16_8_;
  local_e8.origin_.e[1] = 0.0;
  local_e8.origin_.e[2] = -1.0;
  local_108 = 0x3ff0000000000000;
  uStack_100 = 0;
  local_f8 = 0;
  std::make_shared<Lambertian,Vec3>((Vec3 *)local_1d0);
  std::make_shared<Sphere,Vec3,double&,std::shared_ptr<Lambertian>>
            ((Vec3 *)local_1b8,(double *)&local_e8,(shared_ptr<Lambertian> *)(local_1d0 + 0x10));
  local_128.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1b8._0_8_;
  local_128.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
  local_1b8._0_8_ = 0.0;
  local_1b8._8_8_ = 0.0;
  std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::push_back
            (&local_1a0,&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_128.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
  local_148 = 0;
  uStack_140 = 0;
  local_138 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0xbff0000000000000;
  local_188 = 0;
  uStack_184 = 0;
  uStack_180 = 0;
  uStack_17c = 0x3ff00000;
  local_178 = 0;
  look_from.e[2] = 0.0;
  look_from.e[0] = 0.0;
  look_from.e[1] = 0.0;
  look_at.e[2] = -1.0;
  look_at.e[0] = 0.0;
  look_at.e[1] = 0.0;
  Camera::Camera(&local_e8,look_from,look_at,(Vec3)(ZEXT824(0x3ff0000000000000) << 0x40),90.0,
                 1.7777777777777777,0.0,1.0);
  ObjectList::ObjectList(&in_RDI->objects_,(ObjectList *)(local_1b8 + 0x10));
  memcpy(&in_RDI->camera_,&local_e8,0xb0);
  ObjectList::~ObjectList((ObjectList *)(local_1b8 + 0x10));
  return in_RDI;
}

Assistant:

Scene red_blue() {
  ObjectList objects;

  double r = cos(PI/4);
  objects.add(std::make_shared<Sphere>(Point3(-r, 0, -1),
            r,
            std::make_shared<Lambertian>(Color(0,0,1))));
  objects.add(std::make_shared<Sphere>(Point3(r, 0, -1),
            r,
            std::make_shared<Lambertian>(Color(1, 0, 0))));

  // Setup camera
  Point3 camera_position{0, 0, 0};
  Point3 camera_target{0, 0, -1};
  double field_of_view = 90;
  double aperture = 0.0; // no defocus blur

  Camera camera(camera_position,
                camera_target,
                Point3(0, 1, 0),
                field_of_view,
                ASPECT_RATIO,
                aperture,
                (camera_position - camera_target).length());

  return {objects, camera};
}